

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::Options
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,RegexFlags *flags)

{
  EncodedChar EVar1;
  code *pcVar2;
  bool bVar3;
  RegexFlags RVar4;
  uint uVar5;
  undefined4 *puVar6;
  EncodedChar *pEVar7;
  ThreadConfiguration *pTVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  pEVar7 = this->next;
  do {
    if (this->inputLim < pEVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ebe9d7;
      *puVar6 = 0;
      pEVar7 = this->next;
    }
    EVar1 = *pEVar7;
    uVar5 = (uint)(ushort)EVar1;
    lVar11 = 1;
    if (EVar1 == L'\\') {
      uVar5 = 0x5c;
      if (pEVar7 + 6 <= this->inputLim) {
        if (this->inputLim < pEVar7 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ebe9d7;
          *puVar6 = 0;
          pEVar7 = this->next;
        }
        if (pEVar7[1] == L'u') {
          if (this->inputLim < pEVar7 + 2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar3) goto LAB_00ebe9d7;
            *puVar6 = 0;
            pEVar7 = this->next;
          }
          if (((ulong)(ushort)pEVar7[2] < 0x100) &&
             ((ASCIIChars::classes[(ushort)pEVar7[2]] & 0x40) != 0)) {
            if (this->inputLim < pEVar7 + 3) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
              if (!bVar3) goto LAB_00ebe9d7;
              *puVar6 = 0;
              pEVar7 = this->next;
            }
            if (((ulong)(ushort)pEVar7[3] < 0x100) &&
               ((ASCIIChars::classes[(ushort)pEVar7[3]] & 0x40) != 0)) {
              if (this->inputLim < pEVar7 + 4) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar6 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                   ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
                if (!bVar3) goto LAB_00ebe9d7;
                *puVar6 = 0;
                pEVar7 = this->next;
              }
              if (((ulong)(ushort)pEVar7[4] < 0x100) &&
                 ((ASCIIChars::classes[(ushort)pEVar7[4]] & 0x40) != 0)) {
                if (this->inputLim < pEVar7 + 5) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar6 = 1;
                  bVar3 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                     ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
                  if (!bVar3) goto LAB_00ebe9d7;
                  *puVar6 = 0;
                  pEVar7 = this->next;
                }
                if (((ulong)(ushort)pEVar7[5] < 0x100) &&
                   ((ASCIIChars::classes[(ushort)pEVar7[5]] & 0x40) != 0)) {
                  if (((this->scriptContext->config).threadConfig)->m_ES6Unicode != false)
                  goto LAB_00ebe9bc;
                  if (this->inputLim < pEVar7 + 2) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar6 = 1;
                    bVar3 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
                    if (!bVar3) {
LAB_00ebe9d7:
                      pcVar2 = (code *)invalidInstructionException();
                      (*pcVar2)();
                    }
                    *puVar6 = 0;
                    pEVar7 = this->next;
                  }
                  uVar12 = 0;
                  if ((ulong)(ushort)pEVar7[2] < 0x100) {
                    uVar12 = (uint)(byte)ASCIIChars::values[(ushort)pEVar7[2]] << 0xc;
                  }
                  if (this->inputLim < pEVar7 + 3) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar6 = 1;
                    bVar3 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
                    if (!bVar3) goto LAB_00ebe9d7;
                    *puVar6 = 0;
                    pEVar7 = this->next;
                  }
                  uVar9 = 0;
                  if ((ulong)(ushort)pEVar7[3] < 0x100) {
                    uVar9 = (uint)(byte)ASCIIChars::values[(ushort)pEVar7[3]] << 8;
                  }
                  if (this->inputLim < pEVar7 + 4) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar6 = 1;
                    bVar3 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
                    if (!bVar3) goto LAB_00ebe9d7;
                    *puVar6 = 0;
                    pEVar7 = this->next;
                  }
                  uVar10 = 0;
                  if ((ulong)(ushort)pEVar7[4] < 0x100) {
                    uVar10 = (uint)(byte)ASCIIChars::values[(ushort)pEVar7[4]] << 4;
                  }
                  if (this->inputLim < pEVar7 + 5) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar6 = 1;
                    bVar3 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
                    if (!bVar3) goto LAB_00ebe9d7;
                    *puVar6 = 0;
                    pEVar7 = this->next;
                  }
                  uVar5 = 0;
                  if ((ulong)(ushort)pEVar7[5] < 0x100) {
                    uVar5 = (uint)(byte)ASCIIChars::values[(ushort)pEVar7[5]];
                  }
                  uVar10 = uVar9 | uVar12 | uVar10;
                  if (0xffff < uVar10) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar6 = 1;
                    bVar3 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                                       ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
                    if (!bVar3) goto LAB_00ebe9d7;
                    *puVar6 = 0;
                  }
                  uVar5 = uVar5 | uVar10;
                  lVar11 = 6;
                }
              }
            }
          }
        }
      }
    }
    else if (EVar1 == L'\0') {
      return;
    }
    uVar5 = uVar5 & 0xffff;
    switch(uVar5 - 0x67 >> 1 | (uint)((uVar5 - 0x67 & 1) != 0) << 0x1f) {
    case 0:
      RVar4 = *flags;
      if ((RVar4 & GlobalRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | GlobalRegexFlag;
      break;
    case 1:
      RVar4 = *flags;
      if ((RVar4 & IgnoreCaseRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | IgnoreCaseRegexFlag;
      break;
    default:
switchD_00ebe85b_caseD_2:
      if ((0xff < uVar5) || ((ASCIIChars::classes[uVar5] & 1) == 0)) {
        return;
      }
LAB_00ebe9bc:
      Fail(this,-0x7ff5ec67);
      return;
    case 3:
      RVar4 = *flags;
      if ((RVar4 & MultilineRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | MultilineRegexFlag;
      break;
    case 6:
      pTVar8 = (this->scriptContext->config).threadConfig;
      if (pTVar8->m_ES2018RegExDotAll != true) goto LAB_00ebe8f8;
      RVar4 = *flags;
      if ((RVar4 & DotAllRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | DotAllRegexFlag;
      break;
    case 7:
      pTVar8 = (this->scriptContext->config).threadConfig;
LAB_00ebe8f8:
      if (pTVar8->m_ES6Unicode != true) goto LAB_00ebe919;
      RVar4 = *flags;
      if ((RVar4 & UnicodeRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | UnicodeRegexFlag;
      break;
    case 9:
      pTVar8 = (this->scriptContext->config).threadConfig;
LAB_00ebe919:
      if (pTVar8->m_ES6RegExSticky != true) goto switchD_00ebe85b_caseD_2;
      RVar4 = *flags;
      if ((RVar4 & StickyRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | StickyRegexFlag;
    }
    *flags = RVar4;
    pEVar7 = this->next;
    if (this->inputLim < pEVar7 + lVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ebe9d7;
      *puVar6 = 0;
      pEVar7 = this->next;
    }
    pEVar7 = pEVar7 + lVar11;
    this->next = pEVar7;
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::Options(RegexFlags& flags)
    {
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            CharCount consume;
            Char c;

            if (ec == 0)
                // Embedded 0 not valid
                return;
            else if (IsLiteral &&
                ec == '\\' &&
                ECCanConsume(6) &&
                ECLookahead(1) == 'u' &&
                standardEncodedChars->IsHex(ECLookahead(2)) &&
                standardEncodedChars->IsHex(ECLookahead(3)) &&
                standardEncodedChars->IsHex(ECLookahead(4)) &&
                standardEncodedChars->IsHex(ECLookahead(5)))
            {
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    Fail(JSERR_RegExpSyntax);
                    return;
                }
                else
                {
                    uint32 n = (standardEncodedChars->DigitValue(ECLookahead(2)) << 12) |
                               (standardEncodedChars->DigitValue(ECLookahead(3)) << 8) |
                               (standardEncodedChars->DigitValue(ECLookahead(4)) << 4) |
                               (standardEncodedChars->DigitValue(ECLookahead(5)));
                    c = UTC(n);
                    consume = 6;
                }
            }
            else
            {
                c = Chars<EncodedChar>::CTW(ec);
                consume = 1;
            }

            switch (c) {
            case 'i':
                if ((flags & IgnoreCaseRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & GlobalRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & MultilineRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & DotAllRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | DotAllRegexFlag);
                    break;
                }
            case 'u':
                // If we don't have unicode enabled, fall through to default
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if ((flags & UnicodeRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | UnicodeRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, UnicodeRegexFlag, scriptContext);

                    break;
                }
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & StickyRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | StickyRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StickyRegexFlag, scriptContext);

                    break;
                }
            default:
                if (standardChars->IsWord(c))
                {
                    // Outer context could never parse this character. Signal the syntax error as
                    // being part of the regex.
                    Fail(JSERR_RegExpSyntax);
                }
                return;
            }

            ECConsume(consume);
        }
    }